

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseCharDataInternal(xmlParserCtxtPtr ctxt,int partial)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  byte bVar5;
  uint val;
  xmlParserInputPtr pxVar6;
  int iVar7;
  xmlChar *pxVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  xmlChar buf [305];
  
  pxVar6 = ctxt->input;
  uVar3._0_4_ = pxVar6->line;
  uVar3._4_4_ = pxVar6->col;
  uVar2 = (undefined4)uVar3;
  uVar4 = uVar3._4_4_;
  uVar12 = 0;
  uVar13 = 0;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    uStack_170 = 0;
    local_178 = uVar3;
    xmlParserGrow(ctxt);
    pxVar6 = ctxt->input;
    uVar2 = (undefined4)local_178;
    uVar4 = local_178._4_4_;
    uVar12 = (undefined4)uStack_170;
    uVar13 = uStack_170._4_4_;
  }
  pbVar10 = pxVar6->cur;
  do {
    while( true ) {
      while (bVar5 = *pbVar10, bVar5 == 10) {
        iVar7 = pxVar6->line;
        pbVar9 = pbVar10;
        do {
          iVar7 = iVar7 + 1;
          pxVar6->line = iVar7;
          pxVar6->col = 1;
          pbVar10 = pbVar9 + 1;
          pbVar1 = pbVar9 + 1;
          pbVar9 = pbVar10;
        } while (*pbVar1 == 10);
      }
      if (bVar5 != 0x20) break;
      pbVar10 = pbVar10 + 1;
      pxVar6->col = pxVar6->col + 1;
    }
    if (bVar5 == 0x3c) {
      pxVar8 = pxVar6->cur;
      iVar7 = (int)pbVar10 - (int)pxVar8;
      if (iVar7 < 1) {
        return;
      }
      pxVar6->cur = pbVar10;
      xmlCharacters(ctxt,pxVar8,iVar7);
      return;
    }
    iVar7 = pxVar6->col;
    while( true ) {
      while( true ) {
        while (""[*pbVar10] != '\0') {
          iVar7 = iVar7 + 1;
          pbVar10 = pbVar10 + 1;
        }
        pxVar6->col = iVar7;
        if (*pbVar10 != 10) break;
        iVar7 = pxVar6->line;
        do {
          iVar7 = iVar7 + 1;
          pxVar6->line = iVar7;
          pxVar6->col = 1;
          pbVar9 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
        } while (*pbVar9 == 10);
        iVar7 = 1;
      }
      if (*pbVar10 != 0x5d) break;
      if ((pbVar10[1] == 0x5d) && (pbVar10[2] == 0x3e)) {
        xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
        ctxt->input->cur = pbVar10 + 1;
        return;
      }
      if ((partial != 0) && ((long)pxVar6->end - (long)pbVar10 < 2)) break;
      iVar7 = iVar7 + 1;
      pxVar6->col = iVar7;
      pbVar10 = pbVar10 + 1;
    }
    pxVar8 = pxVar6->cur;
    iVar7 = (int)pbVar10 - (int)pxVar8;
    if (0 < iVar7) {
      pxVar6->cur = pbVar10;
      xmlCharacters(ctxt,pxVar8,iVar7);
      pxVar6 = ctxt->input;
      uVar2 = pxVar6->line;
      uVar4 = pxVar6->col;
      uVar12 = 0;
      uVar13 = 0;
    }
    pxVar6->cur = pbVar10;
    bVar5 = *pbVar10;
    if (bVar5 == 0xd) {
      if (pbVar10[1] != 10) goto LAB_00135a82;
      pxVar6->cur = pbVar10 + 1;
      pbVar10 = pbVar10 + 2;
      pxVar6->line = pxVar6->line + 1;
      pxVar6->col = 1;
    }
    else {
      if (bVar5 == 0x26) {
        return;
      }
      if (bVar5 == 0x3c) {
        return;
      }
      if (((partial != 0) && (bVar5 == 0x5d)) && ((long)pxVar6->end - (long)pbVar10 < 2)) {
        return;
      }
LAB_00135a82:
      uVar11 = pxVar6->flags;
      if ((uVar11 & 0x40) == 0) {
        local_178 = CONCAT44(uVar4,uVar2);
        uStack_170 = CONCAT44(uVar13,uVar12);
        xmlParserShrink(ctxt);
        pxVar6 = ctxt->input;
        uVar11 = pxVar6->flags;
        uVar2 = (undefined4)local_178;
        uVar4 = local_178._4_4_;
        uVar12 = (undefined4)uStack_170;
        uVar13 = uStack_170._4_4_;
      }
      if (((uVar11 & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
        local_178 = CONCAT44(uVar4,uVar2);
        uStack_170 = CONCAT44(uVar13,uVar12);
        xmlParserGrow(ctxt);
        pxVar6 = ctxt->input;
        uVar2 = (undefined4)local_178;
        uVar4 = local_178._4_4_;
        uVar12 = (undefined4)uStack_170;
        uVar13 = uStack_170._4_4_;
      }
      pbVar10 = pxVar6->cur;
    }
  } while ((byte)(*pbVar10 - 9) < 2 || '\x1f' < (char)*pbVar10);
  pxVar6->line = uVar2;
  pxVar6->col = uVar4;
  uVar11 = 0;
LAB_00135afa:
  val = xmlCurrentCharRecover(ctxt,&local_17c);
  if ((val == 0x26) || (val == 0x3c)) {
LAB_00135cbb:
    if (uVar11 != 0) {
      buf[(int)uVar11] = '\0';
      xmlCharacters(ctxt,buf,uVar11);
    }
    pbVar10 = ctxt->input->cur;
    if ((pbVar10 < ctxt->input->end) &&
       ((0x37 < val - 0x26 || ((0x80000000400001U >> ((ulong)(val - 0x26) & 0x3f) & 1) == 0)))) {
      if ((val == 0) && (bVar5 = *pbVar10, bVar5 != 0)) {
        if (partial != 0) {
          return;
        }
        xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"Incomplete UTF-8 sequence starting with %02X\n"
                          ,(uint)bVar5);
        pxVar6 = ctxt->input;
        if (*pxVar6->cur == '\n') {
          pxVar6->line = pxVar6->line + 1;
          pxVar6->col = 1;
        }
        else {
          pxVar6->col = pxVar6->col + 1;
        }
        pxVar8 = pxVar6->cur + 1;
      }
      else {
        xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"PCDATA invalid Char value %d\n",val);
        pxVar6 = ctxt->input;
        if (*pxVar6->cur == '\n') {
          pxVar6->line = pxVar6->line + 1;
          pxVar6->col = 1;
        }
        else {
          pxVar6->col = pxVar6->col + 1;
        }
        pxVar8 = pxVar6->cur + local_17c;
      }
      pxVar6->cur = pxVar8;
    }
    return;
  }
  if (val == 0x5d && partial != 0) {
    pxVar8 = ctxt->input->cur;
    if ((long)ctxt->input->end - (long)pxVar8 < 2) goto LAB_00135cbb;
LAB_00135b7f:
    if ((pxVar8[1] == ']') && (pxVar8[2] == '>')) {
      xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
    }
  }
  else {
    if (0xff < (int)val) {
      if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) goto LAB_00135cbb;
LAB_00135bd7:
      iVar7 = xmlCopyCharMultiByte(buf + (int)uVar11,val);
      uVar11 = uVar11 + iVar7;
      goto LAB_00135bea;
    }
    if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) goto LAB_00135b98;
    if ((int)val < 0x20) goto LAB_00135cbb;
    if (val == 0x5d) {
      pxVar8 = ctxt->input->cur;
      goto LAB_00135b7f;
    }
    if (0x7f < val) goto LAB_00135bd7;
  }
LAB_00135b98:
  buf[(int)uVar11] = (xmlChar)val;
  uVar11 = uVar11 + 1;
LAB_00135bea:
  pxVar6 = ctxt->input;
  if (*pxVar6->cur == '\n') {
    pxVar6->line = pxVar6->line + 1;
    pxVar6->col = 1;
  }
  else {
    pxVar6->col = pxVar6->col + 1;
  }
  pxVar6->cur = pxVar6->cur + local_17c;
  if (299 < (int)uVar11) {
    buf[uVar11] = '\0';
    xmlCharacters(ctxt,buf,uVar11);
    uVar11 = 0;
    if ((ctxt->input->flags & 0x40) == 0) {
      xmlParserShrink(ctxt);
    }
  }
  goto LAB_00135afa;
}

Assistant:

static void
xmlParseCharDataInternal(xmlParserCtxtPtr ctxt, int partial) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;

    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
get_more_space:
        while (*in == 0x20) { in++; ctxt->input->col++; }
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more_space;
        }
        if (*in == '<') {
            nbchar = in - ctxt->input->cur;
            if (nbchar > 0) {
                const xmlChar *tmp = ctxt->input->cur;
                ctxt->input->cur = in;

                xmlCharacters(ctxt, tmp, nbchar);
            }
            return;
        }

get_more:
        ccol = ctxt->input->col;
        while (test_char_data[*in]) {
            in++;
            ccol++;
        }
        ctxt->input->col = ccol;
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more;
        }
        if (*in == ']') {
            if ((in[1] == ']') && (in[2] == '>')) {
                xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
                ctxt->input->cur = in + 1;
                return;
            }
            if ((!partial) || (ctxt->input->end - in >= 2)) {
                in++;
                ctxt->input->col++;
                goto get_more;
            }
        }
        nbchar = in - ctxt->input->cur;
        if (nbchar > 0) {
            const xmlChar *tmp = ctxt->input->cur;
            ctxt->input->cur = in;

            xmlCharacters(ctxt, tmp, nbchar);

            line = ctxt->input->line;
            col = ctxt->input->col;
        }
        ctxt->input->cur = in;
        if (*in == 0xD) {
            in++;
            if (*in == 0xA) {
                ctxt->input->cur = in;
                in++;
                ctxt->input->line++; ctxt->input->col = 1;
                continue; /* while */
            }
            in--;
        }
        if (*in == '<') {
            return;
        }
        if (*in == '&') {
            return;
        }
        if ((partial) && (*in == ']') && (ctxt->input->end - in < 2)) {
            return;
        }
        SHRINK;
        GROW;
        in = ctxt->input->cur;
    } while (((*in >= 0x20) && (*in <= 0x7F)) ||
             (*in == 0x09) || (*in == 0x0a));
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, partial);
}